

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::SimpleFormatter::formatAndReplace
          (SimpleFormatter *this,UnicodeString **values,int32_t valuesLength,UnicodeString *result,
          int32_t *offsets,int32_t offsetsLength,UErrorCode *errorCode)

{
  ushort uVar1;
  uint uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  int compiledPatternLength;
  int iVar6;
  int iVar7;
  char16_t *local_80;
  UnicodeString resultCopy;
  
  if (U_ZERO_ERROR < *errorCode) {
    return result;
  }
  if ((valuesLength < 0) || (values == (UnicodeString **)0x0 && valuesLength != 0)) {
LAB_002a79f1:
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return result;
  }
  if ((offsetsLength < 0) || (offsets == (int32_t *)0x0 && offsetsLength != 0)) goto LAB_002a79f1;
  uVar1 = (this->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      local_80 = (this->compiledPattern).fUnion.fFields.fArray;
    }
    else {
      local_80 = (this->compiledPattern).fUnion.fStackFields.fBuffer;
    }
  }
  else {
    local_80 = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    compiledPatternLength = (this->compiledPattern).fUnion.fFields.fLength;
  }
  else {
    compiledPatternLength = (int)(short)uVar1 >> 5;
  }
  if (compiledPatternLength == 0) {
    resultCopy.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e5ab8
    ;
    resultCopy.fUnion.fStackFields.fLengthAndFlags = 2;
  }
  else {
    if ((uint)valuesLength < (uint)(ushort)*local_80) goto LAB_002a79f1;
    resultCopy.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e5ab8
    ;
    resultCopy.fUnion.fStackFields.fLengthAndFlags = 2;
    if ((*local_80 != L'\0') && (1 < compiledPatternLength)) {
      uVar4 = 0xffffffff;
      iVar6 = 1;
      do {
        uVar5 = (uint)(ushort)local_80[iVar6];
        uVar2 = uVar4;
        if (uVar5 < 0x100) {
          iVar7 = iVar6 + 1;
          iVar6 = iVar7;
          if ((((values[uVar5] == result) && (uVar2 = uVar5, iVar6 = 2, iVar7 != 2)) &&
              (uVar2 = uVar4, iVar6 = iVar7,
              (ushort)resultCopy.fUnion.fStackFields.fLengthAndFlags < 0x20)) &&
             (0x1f < (ushort)(result->fUnion).fStackFields.fLengthAndFlags)) {
            UnicodeString::operator=(&resultCopy,result);
          }
        }
        else {
          iVar6 = uVar5 + iVar6 + -0xff;
        }
        uVar4 = uVar2;
      } while (iVar6 < compiledPatternLength);
      if (-1 < (int)uVar4) goto LAB_002a7a38;
    }
  }
  uVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
  uVar3 = 2;
  if ((uVar1 & 1) == 0) {
    uVar3 = uVar1 & 0x1e;
  }
  (result->fUnion).fStackFields.fLengthAndFlags = uVar3;
LAB_002a7a38:
  format(local_80,compiledPatternLength,values,result,&resultCopy,'\0',offsets,offsetsLength,
         errorCode);
  UnicodeString::~UnicodeString(&resultCopy);
  return result;
}

Assistant:

UnicodeString &SimpleFormatter::formatAndReplace(
        const UnicodeString *const *values, int32_t valuesLength,
        UnicodeString &result,
        int32_t *offsets, int32_t offsetsLength, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return result;
    }
    if (isInvalidArray(values, valuesLength) || isInvalidArray(offsets, offsetsLength)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }
    const UChar *cp = compiledPattern.getBuffer();
    int32_t cpLength = compiledPattern.length();
    if (valuesLength < getArgumentLimit(cp, cpLength)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }

    // If the pattern starts with an argument whose value is the same object
    // as the result, then we keep the result contents and append to it.
    // Otherwise we replace its contents.
    int32_t firstArg = -1;
    // If any non-initial argument value is the same object as the result,
    // then we first copy its contents and use that instead while formatting.
    UnicodeString resultCopy;
    if (getArgumentLimit(cp, cpLength) > 0) {
        for (int32_t i = 1; i < cpLength;) {
            int32_t n = cp[i++];
            if (n < ARG_NUM_LIMIT) {
                if (values[n] == &result) {
                    if (i == 2) {
                        firstArg = n;
                    } else if (resultCopy.isEmpty() && !result.isEmpty()) {
                        resultCopy = result;
                    }
                }
            } else {
                i += n - ARG_NUM_LIMIT;
            }
        }
    }
    if (firstArg < 0) {
        result.remove();
    }
    return format(cp, cpLength, values,
                  result, &resultCopy, FALSE,
                  offsets, offsetsLength, errorCode);
}